

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
duckdb::CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Deserialize(CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *__return_storage_ptr__,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  int iVar3;
  
  __return_storage_ptr__->set_by_user = false;
  (__return_storage_ptr__->value)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value).field_2;
  (__return_storage_ptr__->value)._M_string_length = 0;
  (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"set_by_user");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->set_by_user = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"value");
  (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
  ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return __return_storage_ptr__;
}

Assistant:

CSVOption<T> CSVOption<T>::Deserialize(Deserializer &deserializer) {
	CSVOption<T> result;
	deserializer.ReadPropertyWithDefault<bool>(100, "set_by_user", result.set_by_user);
	deserializer.ReadProperty<T>(101, "value", result.value);
	return result;
}